

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int32 prune_quests(node *sroot,int32 ndesirdnodes)

{
  node *pnVar1;
  node_str *pnVar2;
  uint uVar3;
  int iVar4;
  node **idlist;
  void *ptr;
  int *ptr_00;
  float *ptr_01;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  size_t n_elem;
  float fVar10;
  
  idlist = (node **)__ckd_calloc__(0x400,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x250);
  uVar8 = 0;
  uVar3 = id_nodes(sroot,idlist,0);
  n_elem = (size_t)(int)uVar3;
  ptr = __ckd_calloc__(n_elem,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x255);
  ptr_00 = (int *)__ckd_calloc__(n_elem,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x256);
  ptr_01 = (float *)__ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,599);
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar8;
  }
  iVar9 = 0;
  iVar4 = 0;
  iVar6 = 0;
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    pnVar1 = idlist[uVar8];
    if (0 < pnVar1->depth) {
      iVar9 = iVar9 + (uint)((uint)pnVar1->depth < 4 || 1 < pnVar1->nphones);
    }
    pnVar2 = pnVar1->left;
    if (pnVar2 == (node_str *)0x0) {
      if (pnVar1->right == (node_str *)0x0) {
        lVar7 = (long)iVar4;
        iVar4 = iVar4 + 1;
        *(int *)((long)ptr + lVar7 * 4) = (int)uVar8;
      }
    }
    else if (((pnVar2->left == (node_str *)0x0) && (pnVar2->right == (node_str *)0x0)) &&
            ((pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0 &&
             ((pnVar2->left == (node_str *)0x0 && (pnVar2->right == (node_str *)0x0)))))) {
      ptr_00[iVar6] = (int)uVar8;
      ptr_01[iVar6] = (float)pnVar1->lkhd_dec;
      iVar6 = iVar6 + 1;
    }
  }
  while (ndesirdnodes + 1 < iVar9) {
    fVar10 = *ptr_01;
    iVar4 = *ptr_00;
    for (lVar7 = 1; lVar7 < iVar6; lVar7 = lVar7 + 1) {
      if (fVar10 < ptr_01[lVar7]) {
        iVar4 = ptr_00[lVar7];
        fVar10 = ptr_01[lVar7];
      }
    }
    free_tree(idlist[iVar4]->left);
    free_tree(idlist[iVar4]->right);
    idlist[iVar4]->right = (node_str *)0x0;
    idlist[iVar4]->left = (node_str *)0x0;
    ckd_free(idlist);
    idlist = (node **)__ckd_calloc__(0x400,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                     ,0x272);
    uVar8 = 0;
    uVar3 = id_nodes(sroot,idlist,0);
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar8;
    }
    iVar9 = 0;
    iVar4 = 0;
    iVar6 = 0;
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      pnVar1 = idlist[uVar8];
      if (0 < pnVar1->depth) {
        iVar9 = iVar9 + (uint)((uint)pnVar1->depth < 4 || 1 < pnVar1->nphones);
      }
      pnVar2 = pnVar1->left;
      if (pnVar2 == (node_str *)0x0) {
        if (pnVar1->right == (node_str *)0x0) {
          lVar7 = (long)iVar4;
          iVar4 = iVar4 + 1;
          *(int *)((long)ptr + lVar7 * 4) = (int)uVar8;
        }
      }
      else if ((((pnVar2->left == (node_str *)0x0) && (pnVar2->right == (node_str *)0x0)) &&
               (pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0)) &&
              ((pnVar2->left == (node_str *)0x0 && (pnVar2->right == (node_str *)0x0)))) {
        ptr_00[iVar6] = (int)uVar8;
        ptr_01[iVar6] = (float)pnVar1->lkhd_dec;
        iVar6 = iVar6 + 1;
      }
    }
  }
  ckd_free(idlist);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(ptr_01);
  return iVar9;
}

Assistant:

int32 prune_quests(node *sroot, int32 ndesirdnodes)
{
    float32 *twiglkhddec,maxdec;
    int32  *leaflist, nquests, nleaves, *twiglist, ntwigs;
    int32  nnodes,i,maxid;
    node   **idlist;

    /* Ignore root node == preincrement ndesirdnodes */
    ndesirdnodes++;
    /* Overallocate idlist */
    idlist = (node **) ckd_calloc(1024,sizeof(node *));
    /* First "id" all the nodes */
    nnodes = id_nodes(sroot,idlist,0);

    /* Allocate lists (overallocate for safety margin) */
    leaflist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglkhddec = (float32 *) ckd_calloc(nnodes,sizeof(float32));

    nleaves = ntwigs = nquests = 0;
    for(i=0;i<nnodes;i++) {
        if (IS_QUEST(idlist[i])) nquests++;
        if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
        else if (IS_TWIG(idlist[i])) {
            twiglist[ntwigs] = i;
            twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
        }
    }

    while (nquests > ndesirdnodes) {
        /* find twig for which likelihood decerase was maximum */
        maxdec = twiglkhddec[0]; maxid = twiglist[0];
        for (i=1; i<ntwigs;i++) {
            if (twiglkhddec[i] > maxdec) {
                maxdec = twiglkhddec[i];
                maxid = twiglist[i];
            }
        }
        /* remove children of twig, make twig a leaf, eliminate it from
           the node list, and continue */
        free_tree(idlist[maxid]->left); free_tree(idlist[maxid]->right);
        idlist[maxid]->left = idlist[maxid]->right = NULL;

        ckd_free(idlist);
        idlist = (node **) ckd_calloc(1024,sizeof(node *));
        nnodes = id_nodes(sroot,idlist,0);
        nleaves = ntwigs = nquests = 0;
        for(i=0;i<nnodes;i++) {
            if (IS_QUEST(idlist[i])) nquests++;
            if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
            else if (IS_TWIG(idlist[i])) {
                twiglist[ntwigs] = i;
                twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
            }
        }
    }
    ckd_free(idlist); ckd_free(leaflist);
    ckd_free(twiglist); ckd_free(twiglkhddec);

    return(nquests);
}